

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ProducerPortProxy::NotifyDataSourceStarted
          (ProducerPortProxy *this,NotifyDataSourceStartedRequest *request,
          DeferredNotifyDataSourceStartedResponse *reply,int fd)

{
  allocator<char> local_89;
  _Any_data local_88;
  long local_78;
  undefined8 local_70;
  _Any_data local_68;
  long local_58;
  undefined8 uStack_50;
  string local_48;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"NotifyDataSourceStarted",&local_89);
  ipc::DeferredBase::DeferredBase((DeferredBase *)&local_68,&reply->super_DeferredBase);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = uStack_50;
  if (local_58 != 0) {
    local_88._M_unused._M_object = local_68._M_unused._M_object;
    local_88._8_8_ = local_68._8_8_;
    local_78 = local_58;
    local_58 = 0;
    uStack_50 = 0;
  }
  ipc::ServiceProxy::BeginInvoke
            (&this->super_ServiceProxy,&local_48,&request->super_CppMessageObj,
             (DeferredBase *)&local_88,fd);
  ipc::DeferredBase::~DeferredBase((DeferredBase *)&local_88);
  ipc::DeferredBase::~DeferredBase((DeferredBase *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ProducerPortProxy::NotifyDataSourceStarted(const NotifyDataSourceStartedRequest& request, DeferredNotifyDataSourceStartedResponse reply, int fd) {
  BeginInvoke("NotifyDataSourceStarted", request, ::perfetto::ipc::DeferredBase(std::move(reply)),
              fd);
}